

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O2

int CCharmap::name_is_ascii_synonym(char *table_name)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = stricmp(table_name,"us-ascii");
  uVar2 = 1;
  if (iVar1 != 0) {
    iVar1 = stricmp(table_name,"asc7dflt");
    if (iVar1 != 0) {
      iVar1 = stricmp(table_name,"ascii");
      if (iVar1 != 0) {
        iVar1 = stricmp(table_name,"iso646-us");
        if (iVar1 != 0) {
          iVar1 = stricmp(table_name,"iso-ir-6");
          if (iVar1 != 0) {
            iVar1 = stricmp(table_name,"cp367");
            if (iVar1 != 0) {
              iVar1 = stricmp(table_name,"us");
              uVar2 = (uint)(iVar1 == 0);
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int name_is_ascii_synonym(const char *table_name)
    {
        /* accept any of the various synonyms for ASCII */
        return (stricmp(table_name, "us-ascii") == 0
                || stricmp(table_name, "asc7dflt") == 0
                || stricmp(table_name, "ascii") == 0
                || stricmp(table_name, "iso646-us") == 0
                || stricmp(table_name, "iso-ir-6") == 0
                || stricmp(table_name, "cp367") == 0
                || stricmp(table_name, "us") == 0);
    }